

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

void __thiscall icu_63::ServiceEnumeration::reset(ServiceEnumeration *this,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *status_local;
  ServiceEnumeration *this_local;
  
  if (*status == U_ENUM_OUT_OF_SYNC_ERROR) {
    *status = U_ZERO_ERROR;
  }
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    iVar2 = ICUService::getTimestamp(&this->_service->super_ICUService);
    this->_timestamp = iVar2;
    this->_pos = 0;
    ICUService::getVisibleIDs(&this->_service->super_ICUService,&this->_ids,status);
  }
  return;
}

Assistant:

virtual void reset(UErrorCode& status) {
        if (status == U_ENUM_OUT_OF_SYNC_ERROR) {
            status = U_ZERO_ERROR;
        }
        if (U_SUCCESS(status)) {
            _timestamp = _service->getTimestamp();
            _pos = 0;
            _service->getVisibleIDs(_ids, status);
        }
    }